

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode canon_query(Curl_easy *data,char *query,dynbuf *dq)

{
  int iVar1;
  size_t sVar2;
  _Bool local_461;
  char *pcStack_460;
  _Bool found_equals;
  char *q;
  char *amp;
  pair *ap;
  pair array [64];
  char *local_40;
  char *p;
  int local_30;
  int i;
  int entry;
  CURLcode result;
  dynbuf *dq_local;
  char *query_local;
  Curl_easy *data_local;
  
  i = 0;
  local_30 = 0;
  amp = (char *)&ap;
  local_40 = query;
  iVar1 = local_30;
  if (query == (char *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    do {
      local_30 = iVar1;
      iVar1 = local_30 + 1;
      *(char **)amp = local_40;
      q = strchr(local_40,0x26);
      if (q == (char *)0x0) {
        sVar2 = strlen(local_40);
        *(size_t *)(amp + 8) = sVar2;
        break;
      }
      *(long *)(amp + 8) = (long)q - (long)local_40;
      amp = amp + 0x10;
      local_40 = q + 1;
    } while (iVar1 < 0x40);
    if (iVar1 == 0x40) {
      Curl_failf(data,"aws-sigv4: too many query pairs in URL");
      data_local._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      qsort(&ap,(long)iVar1,0x10,compare_func);
      amp = (char *)&ap;
      for (p._4_4_ = 0; i == 0 && p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
        pcStack_460 = *(char **)amp;
        local_461 = false;
        if (*(long *)(amp + 8) != 0) {
          i = canon_string(pcStack_460,*(size_t *)(amp + 8),dq,&local_461);
          if ((i == CURLE_OK) && ((local_461 & 1U) == 0)) {
            i = Curl_dyn_addn(dq,"=",1);
          }
          if ((i == 0) && (p._4_4_ < local_30)) {
            i = Curl_dyn_addn(dq,"&",1);
          }
        }
        amp = amp + 0x10;
      }
      data_local._4_4_ = i;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode canon_query(struct Curl_easy *data,
                            const char *query, struct dynbuf *dq)
{
  CURLcode result = CURLE_OK;
  int entry = 0;
  int i;
  const char *p = query;
  struct pair array[MAX_QUERYPAIRS];
  struct pair *ap = &array[0];
  if(!query)
    return result;

  /* sort the name=value pairs first */
  do {
    char *amp;
    entry++;
    ap->p = p;
    amp = strchr(p, '&');
    if(amp)
      ap->len = amp - p; /* excluding the ampersand */
    else {
      ap->len = strlen(p);
      break;
    }
    ap++;
    p = amp + 1;
  } while(entry < MAX_QUERYPAIRS);
  if(entry == MAX_QUERYPAIRS) {
    /* too many query pairs for us */
    failf(data, "aws-sigv4: too many query pairs in URL");
    return CURLE_URL_MALFORMAT;
  }

  qsort(&array[0], entry, sizeof(struct pair), compare_func);

  ap = &array[0];
  for(i = 0; !result && (i < entry); i++, ap++) {
    const char *q = ap->p;
    bool found_equals = FALSE;
    if(!ap->len)
      continue;
    result = canon_string(q, ap->len, dq, &found_equals);
    if(!result && !found_equals) {
      /* queries without value still need an equals */
      result = Curl_dyn_addn(dq, "=", 1);
    }
    if(!result && i < entry - 1) {
      /* insert ampersands between query pairs */
      result = Curl_dyn_addn(dq, "&", 1);
    }
  }
  return result;
}